

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_KillInSector(FParser *this)

{
  AActor *target;
  bool bVar1;
  uint uVar2;
  bool local_51;
  TAngle<double> local_48;
  FName local_3c;
  TFlags<ActorFlag3,_unsigned_int> local_38;
  int local_34;
  AActor *pAStack_30;
  int tag;
  AActor *mo;
  TThinkerIterator<AActor> it;
  FParser *this_local;
  
  it.super_FThinkerIterator._16_8_ = this;
  bVar1 = CheckArgs(this,1);
  if (bVar1) {
    TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&mo,0x80);
    local_34 = intvalue(this->t_argv);
    while (pAStack_30 = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&mo,false),
          pAStack_30 != (AActor *)0x0) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_38,
                 (int)pAStack_30 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG)
                );
      uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_38);
      local_51 = false;
      if (uVar2 != 0) {
        local_51 = FTagManager::SectorHasTag(&tagManager,pAStack_30->Sector,local_34);
      }
      target = pAStack_30;
      if (local_51 != false) {
        FName::FName(&local_3c,NAME_Massacre);
        TAngle<double>::TAngle(&local_48,0.0);
        P_DamageMobj(target,(AActor *)0x0,(AActor *)0x0,1000000,&local_3c,0,&local_48);
      }
    }
  }
  return;
}

Assistant:

void  FParser::SF_KillInSector()
{
	if (CheckArgs(1))
	{
		TThinkerIterator<AActor> it;
		AActor * mo;
		int tag=intvalue(t_argv[0]);

		while ((mo=it.Next()))
		{
			if (mo->flags3&MF3_ISMONSTER && tagManager.SectorHasTag(mo->Sector, tag)) P_DamageMobj(mo, NULL, NULL, 1000000, NAME_Massacre);
		}
	}
}